

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateClassDefinition
          (MessageGenerator *this,Printer *printer)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  string *value1;
  FileDescriptor *file;
  pointer pFVar4;
  pointer pFVar5;
  bool bVar6;
  scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator> *this_00;
  MessageGenerator *this_01;
  mapped_type *pmVar7;
  scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator> *this_02;
  EnumGenerator *this_03;
  scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator> *this_04;
  ExtensionGenerator *this_05;
  Descriptor *pDVar8;
  LogMessage *pLVar9;
  FieldGenerator *pFVar10;
  int i_00;
  Descriptor *descriptor;
  char *pcVar11;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar12;
  int i_5;
  ulong uVar13;
  FieldGroup *pFVar14;
  int i;
  long lVar15;
  long lVar16;
  int j;
  ulong uVar17;
  int i_4;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  pointer *pppFVar21;
  LogFinisher local_139;
  FieldGroup field_group;
  FieldGroup *local_100;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_4;
  vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  aligned_to_8;
  
  for (lVar15 = 0; lVar15 < *(int *)(this->descriptor_ + 0x38); lVar15 = lVar15 + 1) {
    this_00 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>_>
              ::operator[](&this->nested_generators_,lVar15);
    this_01 = internal::scoped_ptr<google::protobuf::compiler::cxx::MessageGenerator>::operator->
                        (this_00);
    GenerateClassDefinition(this_01,printer);
    io::Printer::Print(printer,"\n");
    io::Printer::Print(printer,
                       "// -------------------------------------------------------------------\n");
    io::Printer::Print(printer,"\n");
  }
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&field_group,"classname",(allocator<char> *)&aligned_to_1);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&field_group);
  std::__cxx11::string::_M_assign((string *)pmVar7);
  std::__cxx11::string::~string((string *)&field_group);
  SimpleItoa_abi_cxx11_
            ((string *)&field_group,(protobuf *)(ulong)*(uint *)(this->descriptor_ + 0x2c),i_00);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aligned_to_1,"field_count",(allocator<char> *)&aligned_to_4);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&aligned_to_1);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&field_group);
  std::__cxx11::string::~string((string *)&aligned_to_1);
  std::__cxx11::string::~string((string *)&field_group);
  if ((this->options_).dllexport_decl._M_string_length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&field_group,"dllexport",(allocator<char> *)&aligned_to_1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&field_group);
    std::__cxx11::string::assign((char *)pmVar7);
  }
  else {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&field_group
                   ,&(this->options_).dllexport_decl," ");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&aligned_to_1,"dllexport",(allocator<char> *)&aligned_to_4);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&vars,(key_type *)&aligned_to_1);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&field_group);
    std::__cxx11::string::~string((string *)&aligned_to_1);
  }
  std::__cxx11::string::~string((string *)&field_group);
  SuperClassName_abi_cxx11_((string *)&field_group,(cxx *)this->descriptor_,descriptor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&aligned_to_1,"superclass",(allocator<char> *)&aligned_to_4);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&vars,(key_type *)&aligned_to_1);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&field_group);
  std::__cxx11::string::~string((string *)&aligned_to_1);
  std::__cxx11::string::~string((string *)&field_group);
  io::Printer::Print(printer,&vars,
                     "class $dllexport$$classname$ : public $superclass$ {\n public:\n");
  io::Printer::Indent(printer);
  io::Printer::Print(printer,&vars,
                     "$classname$();\nvirtual ~$classname$();\n\n$classname$(const $classname$& from);\n\ninline $classname$& operator=(const $classname$& from) {\n  CopyFrom(from);\n  return *this;\n}\n\n"
                    );
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,
                       "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n  return _unknown_fields_;\n}\n\ninline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n  return &_unknown_fields_;\n}\n\n"
                      );
    if ((*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) != 3) &&
       (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x59) == '\0')) {
      io::Printer::Print(printer,&vars,
                         "static const ::google::protobuf::Descriptor* descriptor();\n");
    }
  }
  io::Printer::Print(printer,&vars,"static const $classname$& default_instance();\n\n");
  bVar6 = StaticInitializersForced(*(FileDescriptor **)(this->descriptor_ + 0x10));
  if (!bVar6) {
    io::Printer::Print(printer,&vars,
                       "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n// Returns the internal default instance pointer. This function can\n// return NULL thus should not be used by the user. This is intended\n// for Protobuf internal code. Please use default_instance() declared\n// above instead.\nstatic inline const $classname$* internal_default_instance() {\n  return default_instance_;\n}\n#endif\n\n"
                      );
  }
  io::Printer::Print(printer,&vars,
                     "void Swap($classname$* other);\n\n// implements Message ----------------------------------------------\n\n$classname$* New() const;\n"
                    );
  iVar18 = *(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50);
  if (iVar18 != 2) {
    if (iVar18 == 3) {
      pcVar11 = "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n";
    }
    else {
      pcVar11 = 
      "void CopyFrom(const ::google::protobuf::Message& from);\nvoid MergeFrom(const ::google::protobuf::Message& from);\n"
      ;
    }
    io::Printer::Print(printer,&vars,pcVar11);
    io::Printer::Print(printer,&vars,
                       "void CopyFrom(const $classname$& from);\nvoid MergeFrom(const $classname$& from);\nvoid Clear();\nbool IsInitialized() const;\n\nint ByteSize() const;\nbool MergePartialFromCodedStream(\n    ::google::protobuf::io::CodedInputStream* input);\nvoid SerializeWithCachedSizes(\n    ::google::protobuf::io::CodedOutputStream* output) const;\n"
                      );
    if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 1) {
      io::Printer::Print(printer,
                         "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n"
                        );
    }
  }
  io::Printer::Print(printer,&vars,
                     "int GetCachedSize() const { return _cached_size_; }\nprivate:\nvoid SharedCtor();\nvoid SharedDtor();\nvoid SetCachedSize(int size) const;\npublic:\n\n"
                    );
  pcVar11 = "::google::protobuf::Metadata GetMetadata() const;\n\n";
  if (*(int *)(*(long *)(*(long *)(this->descriptor_ + 0x10) + 0x88) + 0x50) == 3) {
    pcVar11 = "::std::string GetTypeName() const;\n\n";
  }
  io::Printer::Print(printer,pcVar11);
  io::Printer::Print(printer,
                     "// xml support -----------------------------------------------------\n\n");
  io::Printer::Print(printer,&vars,
                     "// Parse a protocol buffer contained in a string.\nbool ParseFromXmlString(const std::string& data);\n// Like ParseFromXmlString(), but accepts messages that are missing\n// required fields.\nbool ParsePartialFromXmlString(const std::string& data);\n\n// Serialize the message and store it in the given string.  All required\n// fields must be set.\nbool SerializeToXmlString(std::string* output) const;\n// Like SerializeToXmlString(), but allows missing required fields.\nbool SerializePartialToXmlString(std::string* output) const;\n\n"
                    );
  io::Printer::Print(printer,
                     "// nested types ----------------------------------------------------\n\n");
  lVar15 = 0;
  lVar16 = 0;
  while( true ) {
    iVar18 = *(int *)(this->descriptor_ + 0x38);
    if (iVar18 <= lVar16) break;
    lVar3 = *(long *)(this->descriptor_ + 0x40);
    value1 = *(string **)(lVar3 + lVar15);
    ClassName_abi_cxx11_
              ((string *)&field_group,(cxx *)(lVar3 + lVar15),(Descriptor *)0x0,SUB41(iVar18,0));
    io::Printer::Print(printer,"typedef $nested_full_name$ $nested_name$;\n","nested_name",value1,
                       "nested_full_name",(string *)&field_group);
    std::__cxx11::string::~string((string *)&field_group);
    lVar16 = lVar16 + 1;
    lVar15 = lVar15 + 0x78;
  }
  if (0 < iVar18) {
    io::Printer::Print(printer,"\n");
  }
  for (lVar15 = 0; lVar15 < *(int *)(this->descriptor_ + 0x48); lVar15 = lVar15 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>_>
              ::operator[](&this->enum_generators_,lVar15);
    this_03 = internal::scoped_ptr<google::protobuf::compiler::cxx::EnumGenerator>::operator->
                        (this_02);
    EnumGenerator::GenerateSymbolImports(this_03,printer);
    io::Printer::Print(printer,"\n");
  }
  io::Printer::Print(printer,
                     "// accessors -------------------------------------------------------\n\n");
  GenerateFieldAccessorDeclarations(this,printer);
  for (lVar15 = 0; lVar15 < *(int *)(this->descriptor_ + 0x68); lVar15 = lVar15 + 1) {
    this_04 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar15);
    this_05 = internal::scoped_ptr<google::protobuf::compiler::cxx::ExtensionGenerator>::operator->
                        (this_04);
    ExtensionGenerator::GenerateDeclaration(this_05,printer);
  }
  io::Printer::Print(printer,"// @@protoc_insertion_point(class_scope:$full_name$)\n","full_name",
                     *(string **)(this->descriptor_ + 8));
  io::Printer::Outdent(printer);
  io::Printer::Print(printer," private:\n");
  io::Printer::Indent(printer);
  lVar15 = 0;
  pFVar12 = extraout_RDX;
  for (lVar16 = 0; lVar16 < *(int *)(this->descriptor_ + 0x2c); lVar16 = lVar16 + 1) {
    lVar3 = *(long *)(this->descriptor_ + 0x30);
    if (*(int *)(lVar3 + 0x30 + lVar15) != 3) {
      FieldName_abi_cxx11_((string *)&field_group,(cxx *)(lVar3 + lVar15),pFVar12);
      io::Printer::Print(printer,"inline void set_has_$name$();\n","name",(string *)&field_group);
      std::__cxx11::string::~string((string *)&field_group);
      FieldName_abi_cxx11_
                ((string *)&field_group,(cxx *)(*(long *)(this->descriptor_ + 0x30) + lVar15),field)
      ;
      io::Printer::Print(printer,"inline void clear_has_$name$();\n","name",(string *)&field_group);
      std::__cxx11::string::~string((string *)&field_group);
      pFVar12 = extraout_RDX_00;
    }
    lVar15 = lVar15 + 0x78;
  }
  io::Printer::Print(printer,"\n");
  pDVar8 = this->descriptor_;
  if (0 < *(int *)(pDVar8 + 0x58)) {
    io::Printer::Print(printer,"::google::protobuf::internal::ExtensionSet _extensions_;\n\n");
    pDVar8 = this->descriptor_;
  }
  if (*(int *)(*(long *)(*(long *)(pDVar8 + 0x10) + 0x88) + 0x50) != 3) {
    io::Printer::Print(printer,"::google::protobuf::UnknownFieldSet _unknown_fields_;\n\n");
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar15 = 0;
  for (lVar16 = 0; lVar16 < *(int *)(this->descriptor_ + 0x2c); lVar16 = lVar16 + 1) {
    field_group._0_8_ = *(long *)(this->descriptor_ + 0x30) + lVar15;
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::emplace_back<google::protobuf::FieldDescriptor_const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&fields,(FieldDescriptor **)&field_group);
    lVar15 = lVar15 + 0x78;
  }
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_1.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_4.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  aligned_to_8.
  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar19 = 0;
  do {
    if ((ulong)((long)fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)fields.
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar19) {
      local_100 = aligned_to_1.
                  super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      uVar20 = (long)aligned_to_1.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)aligned_to_1.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      uVar19 = 0;
      while (pFVar5 = aligned_to_4.
                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pFVar4 = aligned_to_4.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar19 < uVar20) {
        field_group._0_8_ = field_group._0_8_ & 0xffffffff00000000;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar1 = uVar19 + 4;
        pFVar14 = local_100;
        uVar17 = uVar1;
        if (uVar20 < uVar1) {
          uVar17 = uVar20;
        }
        for (; uVar19 < uVar17; uVar19 = uVar19 + 1) {
          anon_unknown_0::FieldGroup::Append(&field_group,pFVar14);
          pFVar14 = pFVar14 + 1;
        }
        std::
        vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ::push_back(&aligned_to_4,&field_group);
        std::
        _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~_Vector_base(&field_group.fields_.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
        local_100 = local_100 + 4;
        uVar19 = uVar1;
      }
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>>
                ((__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
                  )aligned_to_4.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
                  )aligned_to_4.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      local_100 = pFVar4;
      uVar20 = (long)pFVar5 - (long)pFVar4 >> 5;
      uVar19 = 0;
      while (pFVar5 = aligned_to_8.
                      super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
            pFVar4 = aligned_to_8.
                     super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                     ._M_impl.super__Vector_impl_data._M_start, uVar19 < uVar20) {
        field_group._0_8_ = field_group._0_8_ & 0xffffffff00000000;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        field_group.fields_.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        uVar1 = uVar19 + 2;
        uVar17 = uVar19;
        pFVar14 = local_100;
        uVar13 = uVar1;
        if (uVar20 < uVar1) {
          uVar13 = uVar20;
        }
        for (; uVar17 < uVar13; uVar17 = uVar17 + 1) {
          anon_unknown_0::FieldGroup::Append(&field_group,pFVar14);
          pFVar14 = pFVar14 + 1;
        }
        if (uVar20 - 1 == uVar19) {
          field_group.preferred_location_ =
               (float)(((long)fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3) + 1);
        }
        std::
        vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ::push_back(&aligned_to_8,&field_group);
        std::
        _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::~_Vector_base(&field_group.fields_.
                         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       );
        local_100 = local_100 + 2;
        uVar19 = uVar1;
      }
      std::
      sort<__gnu_cxx::__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup*,std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>>>>
                ((__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
                  )aligned_to_8.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup_*,_std::vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>_>
                  )aligned_to_8.
                   super__Vector_base<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
      if (fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          fields.
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_start;
      }
      lVar15 = (long)pFVar5 - (long)pFVar4 >> 5;
      pppFVar21 = &(pFVar4->fields_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      while (bVar6 = lVar15 != 0, lVar15 = lVar15 + -1, bVar6) {
        std::
        vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
        ::
        insert<__gnu_cxx::__normal_iterator<google::protobuf::FieldDescriptor_const*const*,std::vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>>,void>
                  ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                    *)&fields,
                   (const_iterator)
                   fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    )((_Vector_impl_data *)(pppFVar21 + -1))->_M_start,
                   (__normal_iterator<const_google::protobuf::FieldDescriptor_*const_*,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                    )*pppFVar21);
        pppFVar21 = pppFVar21 + 4;
      }
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::~vector(&aligned_to_8);
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::~vector(&aligned_to_4);
      std::
      vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
      ::~vector(&aligned_to_1);
      for (uVar19 = 0;
          uVar19 < (ulong)((long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)fields.
                                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 3);
          uVar19 = uVar19 + 1) {
        pFVar10 = FieldGeneratorMap::get
                            (&this->field_generators_,
                             fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar19]);
        (*pFVar10->_vptr_FieldGenerator[2])(pFVar10,printer);
      }
      io::Printer::Print(printer,"\nmutable int _cached_size_;\n");
      if (*(int *)(this->descriptor_ + 0x2c) < 1) {
        io::Printer::Print(printer,"::google::protobuf::uint32 _has_bits_[1];\n\n");
      }
      else {
        io::Printer::Print(printer,&vars,
                           "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n\n");
      }
      file = *(FileDescriptor **)(this->descriptor_ + 0x10);
      GlobalAddDescriptorsName((string *)&field_group,*(string **)file);
      PrintHandlingOptionalStaticInitializers
                (file,printer,"friend void $dllexport_decl$ $adddescriptorsname$();\n",
                 "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n","dllexport_decl",
                 &(this->options_).dllexport_decl,"adddescriptorsname",(string *)&field_group);
      std::__cxx11::string::~string((string *)&field_group);
      GlobalAssignDescriptorsName
                ((string *)&field_group,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
      GlobalShutdownFileName
                ((string *)&aligned_to_1,(string *)**(undefined8 **)(this->descriptor_ + 0x10));
      io::Printer::Print(printer,
                         "friend void $assigndescriptorsname$();\nfriend void $shutdownfilename$();\n\n"
                         ,"assigndescriptorsname",(string *)&field_group,"shutdownfilename",
                         (string *)&aligned_to_1);
      std::__cxx11::string::~string((string *)&aligned_to_1);
      std::__cxx11::string::~string((string *)&field_group);
      io::Printer::Print(printer,
                         "void InitAsDefaultInstance();\nstatic $classname$* default_instance_;\n",
                         "classname",&this->classname_);
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,&vars,"};");
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&vars._M_t);
      return;
    }
    pFVar12 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar19];
    if (pFVar12 == (FieldDescriptor *)0x0) {
LAB_001d363a:
      internal::LogMessage::LogMessage
                ((LogMessage *)&field_group,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                 ,0xf4);
      pLVar9 = internal::LogMessage::operator<<
                         ((LogMessage *)&field_group,"Unknown alignment size.");
      internal::LogFinisher::operator=(&local_139,pLVar9);
      internal::LogMessage::~LogMessage((LogMessage *)&field_group);
    }
    else {
      iVar18 = (int)uVar19;
      if (*(int *)(pFVar12 + 0x30) == 3) {
LAB_001d35bb:
        anon_unknown_0::FieldGroup::FieldGroup(&field_group,(float)iVar18,pFVar12);
        std::
        vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
        ::push_back(&aligned_to_8,(value_type *)&field_group);
      }
      else {
        uVar2 = *(uint *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(pFVar12 + 0x2c) * 4)
        ;
        if (10 < uVar2) {
LAB_001d3601:
          internal::LogMessage::LogMessage
                    ((LogMessage *)&field_group,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/compiler/cxx25x/cxx_message.cc"
                     ,0xb4);
          pLVar9 = internal::LogMessage::operator<<((LogMessage *)&field_group,"Can\'t get here.");
          internal::LogFinisher::operator=(&local_139,pLVar9);
          internal::LogMessage::~LogMessage((LogMessage *)&field_group);
          goto LAB_001d363a;
        }
        if ((0x634U >> (uVar2 & 0x1f) & 1) != 0) goto LAB_001d35bb;
        if ((0x14aU >> (uVar2 & 0x1f) & 1) == 0) {
          if (uVar2 != 7) goto LAB_001d3601;
          anon_unknown_0::FieldGroup::FieldGroup(&field_group,(float)iVar18,pFVar12);
          std::
          vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
          ::push_back(&aligned_to_1,(value_type *)&field_group);
        }
        else {
          anon_unknown_0::FieldGroup::FieldGroup(&field_group,(float)iVar18,pFVar12);
          std::
          vector<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup,_std::allocator<google::protobuf::compiler::cxx::(anonymous_namespace)::FieldGroup>_>
          ::push_back(&aligned_to_4,(value_type *)&field_group);
        }
      }
      std::
      _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ::~_Vector_base(&field_group.fields_.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     );
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void MessageGenerator::
GenerateClassDefinition(io::Printer* printer) {
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    nested_generators_[i]->GenerateClassDefinition(printer);
    printer->Print("\n");
    printer->Print(kThinSeparator);
    printer->Print("\n");
  }

  map<string, string> vars;
  vars["classname"] = classname_;
  vars["field_count"] = SimpleItoa(descriptor_->field_count());
  if (options_.dllexport_decl.empty()) {
    vars["dllexport"] = "";
  } else {
    vars["dllexport"] = options_.dllexport_decl + " ";
  }
  vars["superclass"] = SuperClassName(descriptor_);

  printer->Print(vars,
    "class $dllexport$$classname$ : public $superclass$ {\n"
    " public:\n");
  printer->Indent();

  printer->Print(vars,
    "$classname$();\n"
    "virtual ~$classname$();\n"
    "\n"
    "$classname$(const $classname$& from);\n"
    "\n"
    "inline $classname$& operator=(const $classname$& from) {\n"
    "  CopyFrom(from);\n"
    "  return *this;\n"
    "}\n"
    "\n");

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "inline const ::google::protobuf::UnknownFieldSet& unknown_fields() const {\n"
      "  return _unknown_fields_;\n"
      "}\n"
      "\n"
      "inline ::google::protobuf::UnknownFieldSet* mutable_unknown_fields() {\n"
      "  return &_unknown_fields_;\n"
      "}\n"
      "\n");
  }

  // Only generate this member if it's not disabled.
  if (HasDescriptorMethods(descriptor_->file()) &&
      !descriptor_->options().no_standard_descriptor_accessor()) {
    printer->Print(vars,
      "static const ::google::protobuf::Descriptor* descriptor();\n");
  }

  printer->Print(vars,
    "static const $classname$& default_instance();\n"
    "\n");

  if (!StaticInitializersForced(descriptor_->file())) {
    printer->Print(vars,
      "#ifdef GOOGLE_PROTOBUF_NO_STATIC_INITIALIZER\n"
      "// Returns the internal default instance pointer. This function can\n"
      "// return NULL thus should not be used by the user. This is intended\n"
      "// for Protobuf internal code. Please use default_instance() declared\n"
      "// above instead.\n"
      "static inline const $classname$* internal_default_instance() {\n"
      "  return default_instance_;\n"
      "}\n"
      "#endif\n"
      "\n");
  }


  printer->Print(vars,
    "void Swap($classname$* other);\n"
    "\n"
    "// implements Message ----------------------------------------------\n"
    "\n"
    "$classname$* New() const;\n");

  if (HasGeneratedMethods(descriptor_->file())) {
    if (HasDescriptorMethods(descriptor_->file())) {
      printer->Print(vars,
        "void CopyFrom(const ::google::protobuf::Message& from);\n"
        "void MergeFrom(const ::google::protobuf::Message& from);\n");
    } else {
      printer->Print(vars,
        "void CheckTypeAndMergeFrom(const ::google::protobuf::MessageLite& from);\n");
    }

    printer->Print(vars,
      "void CopyFrom(const $classname$& from);\n"
      "void MergeFrom(const $classname$& from);\n"
      "void Clear();\n"
      "bool IsInitialized() const;\n"
      "\n"
      "int ByteSize() const;\n"
      "bool MergePartialFromCodedStream(\n"
      "    ::google::protobuf::io::CodedInputStream* input);\n"
      "void SerializeWithCachedSizes(\n"
      "    ::google::protobuf::io::CodedOutputStream* output) const;\n");
    if (HasFastArraySerialization(descriptor_->file())) {
      printer->Print(
        "::google::protobuf::uint8* SerializeWithCachedSizesToArray(::google::protobuf::uint8* output) const;\n");
    }
  }

  printer->Print(vars,
    "int GetCachedSize() const { return _cached_size_; }\n"
    "private:\n"
    "void SharedCtor();\n"
    "void SharedDtor();\n"
    "void SetCachedSize(int size) const;\n"
    "public:\n"
    "\n");

  if (HasDescriptorMethods(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::Metadata GetMetadata() const;\n"
      "\n");
  } else {
    printer->Print(
      "::std::string GetTypeName() const;\n"
      "\n");
  }

  printer->Print(
    "// xml support -----------------------------------------------------\n"
    "\n");

  printer->Print(vars,
    "// Parse a protocol buffer contained in a string.\n"
    "bool ParseFromXmlString(const std::string& data);\n"
    "// Like ParseFromXmlString(), but accepts messages that are missing\n"
    "// required fields.\n"
    "bool ParsePartialFromXmlString(const std::string& data);\n"
    "\n"
    "// Serialize the message and store it in the given string.  All required\n"
    "// fields must be set.\n"
    "bool SerializeToXmlString(std::string* output) const;\n"
    "// Like SerializeToXmlString(), but allows missing required fields.\n"
    "bool SerializePartialToXmlString(std::string* output) const;\n"
    "\n");

  printer->Print(
    "// nested types ----------------------------------------------------\n"
    "\n");

  // Import all nested message classes into this class's scope with typedefs.
  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    const Descriptor* nested_type = descriptor_->nested_type(i);
    printer->Print("typedef $nested_full_name$ $nested_name$;\n",
                   "nested_name", nested_type->name(),
                   "nested_full_name", ClassName(nested_type, false));
  }

  if (descriptor_->nested_type_count() > 0) {
    printer->Print("\n");
  }

  // Import all nested enums and their values into this class's scope with
  // typedefs and constants.
  for (int i = 0; i < descriptor_->enum_type_count(); i++) {
    enum_generators_[i]->GenerateSymbolImports(printer);
    printer->Print("\n");
  }

  printer->Print(
    "// accessors -------------------------------------------------------\n"
    "\n");

  // Generate accessor methods for all fields.
  GenerateFieldAccessorDeclarations(printer);

  // Declare extension identifiers.
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    extension_generators_[i]->GenerateDeclaration(printer);
  }


  printer->Print(
    "// @@protoc_insertion_point(class_scope:$full_name$)\n",
    "full_name", descriptor_->full_name());

  // Generate private members.
  printer->Outdent();
  printer->Print(" private:\n");
  printer->Indent();


  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (!descriptor_->field(i)->is_repeated()) {
      printer->Print(
        "inline void set_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
      printer->Print(
        "inline void clear_has_$name$();\n",
        "name", FieldName(descriptor_->field(i)));
    }
  }
  printer->Print("\n");

  // To minimize padding, data members are divided into three sections:
  // (1) members assumed to align to 8 bytes
  // (2) members corresponding to message fields, re-ordered to optimize
  //     alignment.
  // (3) members assumed to align to 4 bytes.

  // Members assumed to align to 8 bytes:

  if (descriptor_->extension_range_count() > 0) {
    printer->Print(
      "::google::protobuf::internal::ExtensionSet _extensions_;\n"
      "\n");
  }

  if (HasUnknownFields(descriptor_->file())) {
    printer->Print(
      "::google::protobuf::UnknownFieldSet _unknown_fields_;\n"
      "\n");
  }

  // Field members:

  vector<const FieldDescriptor*> fields;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    fields.push_back(descriptor_->field(i));
  }
  OptimizePadding(&fields);
  for (int i = 0; i < fields.size(); ++i) {
    field_generators_.get(fields[i]).GeneratePrivateMembers(printer);
  }

  // Members assumed to align to 4 bytes:

  // TODO(kenton):  Make _cached_size_ an atomic<int> when C++ supports it.
  printer->Print(
      "\n"
      "mutable int _cached_size_;\n");

  // Generate _has_bits_.
  if (descriptor_->field_count() > 0) {
    printer->Print(vars,
      "::google::protobuf::uint32 _has_bits_[($field_count$ + 31) / 32];\n"
      "\n");
  } else {
    // Zero-size arrays aren't technically allowed, and MSVC in particular
    // doesn't like them.  We still need to declare these arrays to make
    // other code compile.  Since this is an uncommon case, we'll just declare
    // them with size 1 and waste some space.  Oh well.
    printer->Print(
      "::google::protobuf::uint32 _has_bits_[1];\n"
      "\n");
  }

  // Declare AddDescriptors(), BuildDescriptors(), and ShutdownFile() as
  // friends so that they can access private static variables like
  // default_instance_ and reflection_.
  PrintHandlingOptionalStaticInitializers(
    descriptor_->file(), printer,
    // With static initializers.
    "friend void $dllexport_decl$ $adddescriptorsname$();\n",
    // Without.
    "friend void $dllexport_decl$ $adddescriptorsname$_impl();\n",
    // Vars.
    "dllexport_decl", options_.dllexport_decl,
    "adddescriptorsname",
    GlobalAddDescriptorsName(descriptor_->file()->name()));

  printer->Print(
    "friend void $assigndescriptorsname$();\n"
    "friend void $shutdownfilename$();\n"
    "\n",
    "assigndescriptorsname",
      GlobalAssignDescriptorsName(descriptor_->file()->name()),
    "shutdownfilename", GlobalShutdownFileName(descriptor_->file()->name()));

  printer->Print(
    "void InitAsDefaultInstance();\n"
    "static $classname$* default_instance_;\n",
    "classname", classname_);

  printer->Outdent();
  printer->Print(vars, "};");
}